

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::Extern::MatchImpl<wabt::interp::MemoryType>
          (Extern *this,Store *store,ImportType *import_type,MemoryType *actual,Ptr *out_trap)

{
  ImportType *pIVar1;
  bool bVar2;
  pointer pEVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *pcVar7;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> local_e8;
  Ptr local_d0;
  Enum local_b4;
  undefined1 local_b0 [8];
  string msg;
  string local_78;
  Ptr local_58;
  MemoryType *local_40;
  MemoryType *extern_type;
  Ptr *out_trap_local;
  MemoryType *actual_local;
  ImportType *import_type_local;
  Store *store_local;
  Extern *this_local;
  
  extern_type = (MemoryType *)out_trap;
  out_trap_local = (Ptr *)actual;
  actual_local = (MemoryType *)import_type;
  import_type_local = (ImportType *)store;
  store_local = (Store *)this;
  pEVar3 = std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
           ::get(&import_type->type);
  local_40 = dyn_cast<wabt::interp::MemoryType,wabt::interp::ExternType>(pEVar3);
  pIVar1 = import_type_local;
  if (local_40 == (MemoryType *)0x0) {
    uVar4 = std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::c_str();
    pEVar3 = std::
             unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
             operator->((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                         *)&actual_local[1].limits.max);
    pcVar6 = GetName(pEVar3->kind);
    pcVar7 = GetName(Memory);
    StringPrintf_abi_cxx11_
              (&local_78,"expected import \"%s.%s\" to have kind %s, not %s",uVar4,uVar5,pcVar6,
               pcVar7);
    memset((void *)((long)&msg.field_2 + 8),0,0x18);
    std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector
              ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
               ((long)&msg.field_2 + 8));
    Trap::New(&local_58,(Store *)pIVar1,&local_78,
              (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
              ((long)&msg.field_2 + 8));
    RefPtr<wabt::interp::Trap>::operator=((RefPtr<wabt::interp::Trap> *)extern_type,&local_58);
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_58);
    std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector
              ((vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)
               ((long)&msg.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_78);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    std::__cxx11::string::string((string *)local_b0);
    local_b4 = (Enum)Match(local_40,(MemoryType *)out_trap_local,(string *)local_b0);
    bVar2 = Failed((Result)local_b4);
    pIVar1 = import_type_local;
    if (bVar2) {
      memset(&local_e8,0,0x18);
      std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector(&local_e8);
      Trap::New(&local_d0,(Store *)pIVar1,(string *)local_b0,&local_e8);
      RefPtr<wabt::interp::Trap>::operator=((RefPtr<wabt::interp::Trap> *)extern_type,&local_d0);
      RefPtr<wabt::interp::Trap>::~RefPtr(&local_d0);
      std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector(&local_e8);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    std::__cxx11::string::~string((string *)local_b0);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Extern::MatchImpl(Store& store,
                         const ImportType& import_type,
                         const T& actual,
                         Trap::Ptr* out_trap) {
  const T* extern_type = dyn_cast<T>(import_type.type.get());
  if (!extern_type) {
    *out_trap = Trap::New(
        store,
        StringPrintf("expected import \"%s.%s\" to have kind %s, not %s",
                     import_type.module.c_str(), import_type.name.c_str(),
                     GetName(import_type.type->kind), GetName(T::skind)));
    return Result::Error;
  }

  std::string msg;
  if (Failed(interp::Match(*extern_type, actual, &msg))) {
    *out_trap = Trap::New(store, msg);
    return Result::Error;
  }

  return Result::Ok;
}